

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLtarjan.c
# Opt level: O1

RDL_BCCGraph * RDL_tarjanBCC(RDL_graph *graph)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  uint **ppuVar5;
  RDL_graph **ppRVar6;
  int iVar7;
  uint uVar8;
  void *pvVar9;
  void *pvVar10;
  void *pvVar11;
  RDL_stack *stack;
  RDL_stack *stack_00;
  uint *puVar12;
  uint **ppuVar13;
  uint **ppuVar14;
  uint **__s;
  uint *puVar15;
  uint *puVar16;
  uint *puVar17;
  RDL_graph *pRVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  uint uVar23;
  size_t sVar24;
  ulong uVar25;
  uint uVar26;
  ulong uVar27;
  RDL_BCCGraph *pRVar28;
  bool bVar29;
  uint ii [2];
  int local_b4;
  uint local_68;
  uint local_64;
  RDL_BCCGraph *local_60;
  uint *local_58;
  void *local_50;
  uint **local_48;
  ulong local_40;
  RDL_graph **local_38;
  
  sVar24 = (ulong)graph->V << 2;
  pvVar9 = malloc(sVar24);
  pvVar10 = malloc(sVar24);
  uVar19 = graph->E;
  sVar24 = (ulong)uVar19 * 4;
  pvVar11 = malloc(sVar24);
  if ((ulong)uVar19 != 0) {
    memset(pvVar11,0,sVar24);
  }
  stack = RDL_stack_new();
  local_50 = pvVar11;
  if ((ulong)graph->V == 0) {
    uVar19 = 0;
  }
  else {
    sVar24 = (ulong)graph->V << 2;
    pRVar28 = (RDL_BCCGraph *)0x0;
    memset(pvVar9,0,sVar24);
    memset(pvVar10,0,sVar24);
    local_b4 = 1;
    uVar19 = 0;
    do {
      if (*(int *)((long)pvVar9 + (long)pRVar28 * 4) == 0) {
        stack_00 = RDL_stack_new();
        local_58 = (uint *)malloc((ulong)graph->V << 4);
        *local_58 = (int)pRVar28;
        *(undefined8 *)(local_58 + 1) = 0xffffffff;
        local_58[3] = 0xffffffff;
        uVar19 = uVar19 + 1;
        *(uint *)((long)pvVar9 + (long)pRVar28 * 4) = uVar19;
        *(uint *)((long)pvVar10 + (long)pRVar28 * 4) = uVar19;
        local_60 = pRVar28;
        RDL_stack_push(stack_00,local_58);
        pvVar11 = malloc((ulong)graph->E << 2);
        iVar7 = RDL_stack_empty(stack_00);
        if (iVar7 == 0) {
          uVar23 = 0;
          local_48 = (uint **)CONCAT44(local_48._4_4_,1);
          do {
            puVar12 = (uint *)RDL_stack_top(stack_00);
            uVar2 = *puVar12;
            uVar25 = (ulong)uVar2;
            if (puVar12[2] < graph->degree[uVar25]) {
              uVar3 = puVar12[1];
              uVar21 = graph->adjList[uVar25][puVar12[2]][0];
              uVar27 = (ulong)uVar21;
              uVar8 = RDL_edgeId(graph,uVar2,uVar21);
              pvVar4 = local_50;
              uVar26 = *(uint *)((long)pvVar9 + uVar27 * 4);
              if (uVar26 == 0) {
                *(uint *)((long)pvVar11 + (ulong)uVar23 * 4) = uVar8;
                RDL_stack_push(stack,(void *)((long)pvVar11 + (ulong)uVar23 * 4));
                uVar23 = uVar23 + 1;
                uVar19 = uVar19 + 1;
                *(uint *)((long)pvVar9 + uVar27 * 4) = uVar19;
                *(uint *)((long)pvVar10 + uVar27 * 4) = uVar19;
                uVar25 = (ulong)local_48 & 0xffffffff;
                local_48 = (uint **)CONCAT44(local_48._4_4_,(int)local_48 + 1);
                local_58[uVar25 * 4] = uVar21;
                local_58[uVar25 * 4 + 1] = uVar2;
                *(undefined8 *)(local_58 + uVar25 * 4 + 2) = 0xffffffff00000000;
                RDL_stack_push(stack_00,local_58 + uVar25 * 4);
                puVar12[3] = uVar19;
              }
              else {
                puVar12[2] = puVar12[2] + 1;
                if (uVar26 == puVar12[3]) {
                  uVar2 = *(uint *)((long)pvVar10 + uVar25 * 4);
                  uVar3 = *(uint *)((long)pvVar10 + uVar27 * 4);
                  if (uVar2 < uVar3) {
                    uVar3 = uVar2;
                  }
                  *(uint *)((long)pvVar10 + uVar25 * 4) = uVar3;
                  if (*(uint *)((long)pvVar9 + uVar25 * 4) <= *(uint *)((long)pvVar10 + uVar27 * 4))
                  {
                    do {
                      puVar12 = (uint *)RDL_stack_top(stack);
                      uVar2 = *puVar12;
                      RDL_stack_pop(stack);
                      *(int *)((long)pvVar4 + (ulong)uVar2 * 4) = local_b4;
                    } while (uVar2 != uVar8);
                    local_b4 = local_b4 + 1;
                  }
                }
                else if ((uVar26 < *(uint *)((long)pvVar9 + uVar25 * 4)) && (uVar21 != uVar3)) {
                  *(uint *)((long)pvVar11 + (ulong)uVar23 * 4) = uVar8;
                  RDL_stack_push(stack,(void *)((long)pvVar11 + (ulong)uVar23 * 4));
                  uVar23 = uVar23 + 1;
                  uVar2 = *(uint *)((long)pvVar10 + uVar25 * 4);
                  if (uVar2 < uVar26) {
                    uVar26 = uVar2;
                  }
                  *(uint *)((long)pvVar10 + uVar25 * 4) = uVar26;
                }
              }
            }
            else {
              RDL_stack_pop(stack_00);
            }
            iVar7 = RDL_stack_empty(stack_00);
          } while (iVar7 == 0);
        }
        free(pvVar11);
        free(local_58);
        RDL_stack_delete(stack_00);
        pRVar28 = local_60;
        pvVar11 = local_50;
      }
      pRVar28 = (RDL_BCCGraph *)((long)pRVar28 + 1);
    } while (pRVar28 < (ulong)graph->V);
    uVar19 = local_b4 - 1;
  }
  free(pvVar9);
  free(pvVar10);
  RDL_stack_delete(stack);
  local_60 = (RDL_BCCGraph *)malloc(0x50);
  uVar25 = (ulong)uVar19;
  pvVar9 = malloc(uVar25 * 4);
  pvVar10 = malloc(uVar25 * 4);
  if (uVar19 != 0) {
    memset(pvVar9,0,uVar25 * 4);
  }
  pRVar28 = local_60;
  uVar23 = graph->E;
  uVar27 = (ulong)uVar23;
  if (uVar27 != 0) {
    lVar22 = 0;
    do {
      iVar7 = *(int *)((long)pvVar11 + lVar22 * 4);
      if (iVar7 == 0) {
        (*RDL_outputFunc)(RDL_ERROR,"edge has no associated BCC %u\n");
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rareylab[P]RingDecomposerLib/src/RingDecomposerLib/RDLtarjan.c"
                      ,0xdd,"RDL_BCCGraph *RDL_tarjanBCC(const RDL_graph *)");
      }
      piVar1 = (int *)((long)pvVar9 + (ulong)(iVar7 - 1) * 4);
      *piVar1 = *piVar1 + 1;
      lVar22 = lVar22 + 1;
    } while (uVar23 != (uint)lVar22);
  }
  if (uVar19 == 0) {
    uVar19 = 0;
  }
  else {
    uVar20 = 0;
    uVar19 = 0;
    do {
      if (*(uint *)((long)pvVar9 + uVar20 * 4) < 2) {
        *(uint *)((long)pvVar10 + uVar20 * 4) = 0xfffffffd;
      }
      else {
        *(uint *)((long)pvVar10 + uVar20 * 4) = uVar19;
        uVar19 = uVar19 + 1;
      }
      uVar20 = uVar20 + 1;
    } while (uVar25 != uVar20);
  }
  local_60->complete_graph = graph;
  uVar25 = (ulong)uVar19;
  sVar24 = uVar25 * 8;
  local_38 = (RDL_graph **)malloc(sVar24);
  pRVar28->bcc_graphs = local_38;
  ppuVar13 = (uint **)malloc(uVar27 * 8);
  pRVar28->edge_to_bcc_mapping = ppuVar13;
  if (uVar27 != 0) {
    uVar20 = 0;
    do {
      puVar12 = (uint *)malloc(8);
      ppuVar13[uVar20] = puVar12;
      *puVar12 = 0xfffffffd;
      puVar12[1] = 0xfffffffd;
      uVar20 = uVar20 + 1;
    } while (uVar27 != uVar20);
  }
  ppuVar14 = (uint **)malloc(sVar24);
  pRVar28->edge_from_bcc_mapping = ppuVar14;
  puVar12 = (uint *)malloc(uVar25 * 4);
  pRVar28->nof_edges_per_bcc = puVar12;
  if (uVar19 != 0) {
    memset(ppuVar14,0,uVar25 * 8);
    memset(puVar12,0,uVar25 * 4);
  }
  uVar23 = graph->V;
  local_58 = puVar12;
  local_48 = ppuVar14;
  local_40 = uVar25;
  ppuVar14 = (uint **)malloc((ulong)uVar23 * 8);
  pRVar28->node_to_bcc_mapping = ppuVar14;
  puVar12 = (uint *)malloc((ulong)uVar23 << 2);
  pRVar28->nof_bcc_per_node = puVar12;
  uVar27 = (ulong)graph->V;
  if (uVar27 != 0) {
    memset(puVar12,0,uVar27 * 4);
    memset(ppuVar14,0,uVar27 << 3);
  }
  __s = (uint **)malloc(sVar24);
  pRVar28->node_from_bcc_mapping = __s;
  puVar15 = (uint *)malloc(uVar25 * 4);
  uVar25 = local_40;
  pRVar28->nof_nodes_per_bcc = puVar15;
  if (uVar19 != 0) {
    memset(__s,0,local_40 * 8);
    memset(puVar15,0,uVar25 * 4);
  }
  pRVar28->nof_bcc = uVar19;
  if (graph->E != 0) {
    uVar25 = 0;
    do {
      ppuVar5 = local_48;
      puVar17 = local_58;
      uVar27 = (ulong)(*(int *)((long)local_50 + uVar25 * 4) - 1);
      if (1 < *(uint *)((long)pvVar9 + uVar27 * 4)) {
        uVar23 = *(uint *)((long)pvVar10 + uVar27 * 4);
        puVar16 = ppuVar13[uVar25];
        *puVar16 = uVar23;
        uVar2 = local_58[uVar23];
        local_58[uVar23] = uVar2 + 1;
        puVar16[1] = uVar2;
        puVar16 = (uint *)realloc(local_48[uVar23],(ulong)local_58[uVar23] << 2);
        ppuVar5[uVar23] = puVar16;
        puVar16[puVar17[uVar23] - 1] = (uint)uVar25;
        lVar22 = 0;
        do {
          uVar2 = graph->edges[uVar25][lVar22];
          uVar3 = puVar12[uVar2];
          if ((ulong)uVar3 == 0) {
LAB_0010cefe:
            puVar12[uVar2] = uVar3 + 1;
            puVar17 = (uint *)realloc(ppuVar14[uVar2],(ulong)(uVar3 * 2 + 2) << 3);
            ppuVar14[uVar2] = puVar17;
            uVar21 = puVar12[uVar2];
            puVar17[uVar21 * 2 - 2] = uVar23;
            uVar26 = puVar15[uVar23];
            uVar3 = uVar26 + 1;
            puVar15[uVar23] = uVar3;
            puVar17[uVar21 * 2 - 1] = uVar26;
            puVar17 = (uint *)realloc(__s[uVar23],(ulong)uVar3 << 2);
            __s[uVar23] = puVar17;
            puVar17[puVar15[uVar23] - 1] = uVar2;
          }
          else {
            uVar21 = 0;
            uVar27 = 1;
            bVar29 = false;
            do {
              if (ppuVar14[uVar2][uVar21] == uVar23) {
                bVar29 = true;
              }
              if (uVar3 <= uVar27) break;
              uVar21 = uVar21 + 2;
              uVar27 = uVar27 + 1;
            } while (!bVar29);
            if (!bVar29) goto LAB_0010cefe;
          }
          bVar29 = lVar22 == 0;
          lVar22 = lVar22 + 1;
        } while (bVar29);
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 < graph->E);
  }
  ppRVar6 = local_38;
  uVar25 = local_40;
  pvVar11 = local_50;
  if (uVar19 != 0) {
    uVar27 = 0;
    do {
      pRVar18 = RDL_initNewGraph(puVar15[uVar27]);
      ppRVar6[uVar27] = pRVar18;
      uVar27 = uVar27 + 1;
    } while (uVar25 != uVar27);
  }
  pRVar28 = local_60;
  if (graph->E != 0) {
    uVar25 = 0;
    do {
      uVar19 = *ppuVar13[uVar25];
      if (uVar19 != 0xfffffffd) {
        local_64 = 0xfffffffd;
        local_68 = 0xfffffffd;
        puVar15 = graph->edges[uVar25];
        lVar22 = 0;
        do {
          uVar23 = puVar12[puVar15[lVar22]];
          if ((ulong)uVar23 != 0) {
            puVar17 = ppuVar14[puVar15[lVar22]];
            uVar27 = 0;
            do {
              if (puVar17[uVar27 & 0xffffffff] == uVar19) {
                (&local_68)[lVar22] = puVar17[(int)uVar27 + 1];
              }
              uVar27 = uVar27 + 2;
            } while ((ulong)uVar23 * 2 != uVar27);
          }
          if ((&local_68)[lVar22] == 0xfffffffd) {
            (*RDL_outputFunc)(RDL_ERROR,"node %u not part of BCC %u!\n");
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rareylab[P]RingDecomposerLib/src/RingDecomposerLib/RDLtarjan.c"
                          ,0x14f,"RDL_BCCGraph *RDL_tarjanBCC(const RDL_graph *)");
          }
          bVar29 = lVar22 == 0;
          lVar22 = lVar22 + 1;
        } while (bVar29);
        RDL_addUEdge(ppRVar6[uVar19],local_68,local_64);
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 < graph->E);
  }
  free(pvVar11);
  free(pvVar9);
  free(pvVar10);
  return pRVar28;
}

Assistant:

RDL_BCCGraph* RDL_tarjanBCC(const RDL_graph* graph)
{
  unsigned *bcc, u, node, i, j, k, ii[2],
    nof_bcc, *bcc_size, nof_nontrivial_bcc=0, curr_bcc, found;
  unsigned *non_trivial_mapping;
  RDL_BCCGraph* result;

  nof_bcc = RDL_tarjan(graph, &bcc);

  result = malloc(sizeof(*result));
  bcc_size = malloc(nof_bcc * sizeof(*bcc_size));
  non_trivial_mapping = malloc(nof_bcc * sizeof(*non_trivial_mapping));

  for (i = 0; i < nof_bcc; ++i) {
    bcc_size[i] = 0;
  }

  for (i = 0; i < graph->E; ++i) {
    if (bcc[i] == 0) {
      RDL_outputFunc(RDL_ERROR, "edge has no associated BCC %u\n", i);
      assert(0); /* should NEVER happen */
    }
    curr_bcc = bcc[i];
    ++bcc_size[curr_bcc - 1];
  }

  for (i = 0; i < nof_bcc; ++i) {
    if(bcc_size[i] > 1) {
      non_trivial_mapping[i] = nof_nontrivial_bcc;
      ++nof_nontrivial_bcc;
    }
    else {
      non_trivial_mapping[i] = RDL_NO_RINGSYSTEM;
    }
  }

  result->complete_graph = graph;

  result->bcc_graphs = malloc(nof_nontrivial_bcc * sizeof(*result->bcc_graphs));
  result->edge_to_bcc_mapping = malloc(graph->E * sizeof(*result->edge_to_bcc_mapping));

  for (i = 0; i < graph->E; ++i) {
    result->edge_to_bcc_mapping[i] = malloc(2 * sizeof(**result->edge_to_bcc_mapping));
    result->edge_to_bcc_mapping[i][0] = RDL_NO_RINGSYSTEM;
    result->edge_to_bcc_mapping[i][1] = RDL_NO_RINGSYSTEM;
  }

  result->edge_from_bcc_mapping = malloc(nof_nontrivial_bcc * sizeof(*result->edge_from_bcc_mapping));
  result->nof_edges_per_bcc = malloc(nof_nontrivial_bcc * sizeof(*result->nof_edges_per_bcc));
  for (i = 0; i < nof_nontrivial_bcc; ++i) {
    result->edge_from_bcc_mapping[i] = NULL;
    result->nof_edges_per_bcc[i] = 0;
  }

  result->node_to_bcc_mapping = malloc(graph->V * sizeof(*result->node_to_bcc_mapping));
  result->nof_bcc_per_node = malloc(graph->V * sizeof(*result->nof_bcc_per_node));
  for (i = 0; i < graph->V; ++i) {
    result->nof_bcc_per_node[i] = 0;
    result->node_to_bcc_mapping[i] = NULL;
  }

  result->node_from_bcc_mapping = malloc(nof_nontrivial_bcc * sizeof(*result->node_from_bcc_mapping));
  result->nof_nodes_per_bcc = malloc(nof_nontrivial_bcc * sizeof(*result->nof_nodes_per_bcc));
  for (i = 0; i < nof_nontrivial_bcc; ++i) {
    result->node_from_bcc_mapping[i] = NULL;
    result->nof_nodes_per_bcc[i] = 0;
  }

  result->nof_bcc = nof_nontrivial_bcc;

  for (i = 0; i < graph->E; ++i) {
    curr_bcc = bcc[i];

    /* skip trivial BCCs */
    if (bcc_size[curr_bcc-1] <= 1) {
      continue;
    }

    /* -1 because of 1-based BCCs */
    u = non_trivial_mapping[curr_bcc - 1];
    result->edge_to_bcc_mapping[i][0] = u;
    result->edge_to_bcc_mapping[i][1] = result->nof_edges_per_bcc[u]++;
    result->edge_from_bcc_mapping[u] = realloc(result->edge_from_bcc_mapping[u],
        result->nof_edges_per_bcc[u] * sizeof(**result->edge_from_bcc_mapping));
    result->edge_from_bcc_mapping[u][result->nof_edges_per_bcc[u] - 1] = i;

    for (k = 0; k <= 1; ++k) {
      node = graph->edges[i][k];

      found = 0;
      for (j = 0; j < result->nof_bcc_per_node[node] && !found; ++j) {
        if (result->node_to_bcc_mapping[node][2 * j] == u) {
          found = 1;
        }
      }

      if (!found) {
        ++result->nof_bcc_per_node[node];
        result->node_to_bcc_mapping[node] = realloc(result->node_to_bcc_mapping[node],
            2*result->nof_bcc_per_node[node]*sizeof(result->node_to_bcc_mapping[node]));
        result->node_to_bcc_mapping[node][2*(result->nof_bcc_per_node[node] - 1)] = u;
        result->node_to_bcc_mapping[node][2*(result->nof_bcc_per_node[node] - 1)+1] = result->nof_nodes_per_bcc[u]++;

        result->node_from_bcc_mapping[u] = realloc(result->node_from_bcc_mapping[u],
            result->nof_nodes_per_bcc[u] * sizeof(**result->node_from_bcc_mapping));
        result->node_from_bcc_mapping[u][result->nof_nodes_per_bcc[u]-1] = node;
      }
    }
  }

  for (u = 0; u < nof_nontrivial_bcc; ++u) {
    result->bcc_graphs[u] = RDL_initNewGraph(result->nof_nodes_per_bcc[u]);
  }

  for (i = 0; i < graph->E; ++i) {
    u = result->edge_to_bcc_mapping[i][0];

    /* skip if there is no BCC */
    if (u == RDL_NO_RINGSYSTEM) {
      continue;
    }

    ii[0] = ii[1] = RDL_NO_RINGSYSTEM;

    for (k = 0; k <= 1; ++ k) {
      for (j = 0; j < result->nof_bcc_per_node[graph->edges[i][k]]; ++j) {
        if (result->node_to_bcc_mapping[graph->edges[i][k]][2 * j] == u) {
          ii[k] = result->node_to_bcc_mapping[graph->edges[i][k]][2 * j + 1];
        }
      }
      if (ii[k] == RDL_NO_RINGSYSTEM) {
        RDL_outputFunc(RDL_ERROR, "node %u not part of BCC %u!\n",
            graph->edges[i][k], u);
        /* should never happen */
        assert(0);
      }
    }
    RDL_addUEdge(result->bcc_graphs[u], ii[0], ii[1]);
  }

  free(bcc);
  free(bcc_size);
  free(non_trivial_mapping);

  return result;
}